

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

void __thiscall YAML::detail::node_data::compute_map_size(node_data *this)

{
  bool bVar1;
  list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  *in_RDI;
  _List_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_> jt;
  iterator it;
  _List_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_> in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc8;
  _List_const_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_> local_30;
  _List_node_base *local_28;
  _List_node_base *local_20;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
       ::begin(in_stack_ffffffffffffffb8._M_node);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
         ::end(in_stack_ffffffffffffffb8._M_node);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    local_28 = local_10[0]._M_node;
    local_20 = (_List_node_base *)
               std::next<std::_List_iterator<std::pair<YAML::detail::node*,YAML::detail::node*>>>
                         (in_stack_ffffffffffffffb8,0xf0878b);
    std::_List_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>::operator->
              ((_List_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_> *)in_RDI);
    bVar1 = detail::node::is_defined((node *)0xf087a2);
    if (bVar1) {
      std::_List_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>::operator->
                ((_List_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_> *)in_RDI);
      bVar1 = detail::node::is_defined((node *)0xf087bb);
      if (bVar1) {
        in_stack_ffffffffffffffb8._M_node =
             (_List_node_base *)
             &in_RDI[6].
              super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev;
        std::_List_const_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>::
        _List_const_iterator(&local_30,local_10);
        in_stack_ffffffffffffffc8 =
             std::__cxx11::
             list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
             ::erase(in_RDI,in_stack_ffffffffffffffc8._M_node);
      }
    }
    local_10[0]._M_node = local_20;
  }
  return;
}

Assistant:

void node_data::compute_map_size() const {
  auto it = m_undefinedPairs.begin();
  while (it != m_undefinedPairs.end()) {
    auto jt = std::next(it);
    if (it->first->is_defined() && it->second->is_defined())
      m_undefinedPairs.erase(it);
    it = jt;
  }
}